

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *pFVar1;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ushort uVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *oneof;
  ushort *puVar5;
  Nullable<const_char_*> src;
  size_t n;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  Descriptor *pDVar9;
  Descriptor *pDVar10;
  ImmutableFieldGenerator *pIVar11;
  reference ppVar12;
  OneofGeneratorInfo *pOVar13;
  Nonnull<const_char_*> pcVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  Descriptor *descriptor;
  uint uVar16;
  Printer *pPVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  const_iterator other;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  const_iterator other_00;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  iterator iVar22;
  char *force_builder_init;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Descriptor *local_80;
  Printer *local_78;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_70;
  int local_64;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_60;
  string local_58;
  char *local_38;
  
  pDVar9 = this->descriptor_;
  bVar7 = 0 < pDVar9->field_count_;
  pcVar19 = "";
  local_80 = (Descriptor *)this;
  local_78 = printer;
  if (0 < pDVar9->field_count_) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      pDVar9 = FieldDescriptor::message_type
                         ((FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar20));
      if (pDVar9 != (Descriptor *)0x0) {
        pDVar9 = *(Descriptor **)&local_80->field_count_;
        lVar18 = (long)pDVar9->field_count_;
        if (lVar21 < lVar18) {
          pcVar14 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar21,lVar18,"index < field_count()");
        }
        if (pcVar14 != (Nonnull<const_char_*>)0x0) {
LAB_002aefb6:
          GenerateCommonBuilderMethods();
          goto LAB_002aefc3;
        }
        bVar6 = IsRealOneof((FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar20));
        if (!bVar6) {
          pDVar9 = *(Descriptor **)&local_80->field_count_;
          lVar18 = (long)pDVar9->field_count_;
          if (lVar21 < lVar18) {
            pcVar14 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar21,lVar18,"index < field_count()");
          }
          if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_002aefdd;
          pFVar4 = pDVar9->fields_;
          bVar6 = FieldDescriptor::has_presence
                            ((FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar20));
          if (bVar6) {
            if (((&pFVar4->field_0x3)[lVar20] & 1) != 0) {
              if (((&pFVar4->field_0x1)[lVar20] & 0x10) == 0) {
                lVar18 = 0;
              }
              else {
                lVar18 = *(long *)((long)&pFVar4->scope_ + lVar20);
                if (lVar18 == 0) {
                  protobuf::internal::protobuf_assumption_failed
                            ("res != nullptr",
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                             ,0xb31);
                }
              }
              if (lVar18 == 0) goto LAB_002aefea;
              if ((*(int *)(lVar18 + 4) == 1) &&
                 ((*(byte *)(*(long *)(lVar18 + 0x30) + 1) & 2) != 0)) {
                GenerateCommonBuilderMethods((MessageBuilderGenerator *)local_a0);
                goto LAB_002aefb6;
              }
              if (((&pFVar4->field_0x3)[lVar20] & 1) != 0) goto LAB_002ae6b0;
            }
            pcVar19 = "  maybeForceBuilderInitialization();";
            break;
          }
        }
      }
LAB_002ae6b0:
      lVar21 = lVar21 + 1;
      pDVar9 = *(Descriptor **)&local_80->field_count_;
      lVar20 = lVar20 + 0x58;
      bVar7 = lVar21 < pDVar9->field_count_;
    } while (lVar21 < pDVar9->field_count_);
  }
  pDVar9 = local_80;
  local_38 = pcVar19;
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)local_80->file_,
             *(Descriptor **)&local_80->field_count_,true);
  text._M_str = 
  "// Construct using $classname$.newBuilder()\nprivate Builder() {\n$force_builder_init$\n}\n\n";
  text._M_len = 0x58;
  io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
            (local_78,text,(char (*) [10])0x5620ff,(string *)local_a0,
             (char (*) [19])"force_builder_init",&local_38);
  if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
             *(Descriptor **)&pDVar9->field_count_,true);
  text_00._M_str =
       "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n$force_builder_init$\n}\n"
  ;
  text_00._M_len = 0x7a;
  io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
            (local_78,text_00,(char (*) [10])0x5620ff,(string *)local_a0,
             (char (*) [19])"force_builder_init",&local_38);
  if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  pPVar17 = local_78;
  if (bVar7) {
    text_01._M_str =
         "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage\n          .alwaysUseFieldBuilders) {\n"
    ;
    text_01._M_len = 0x81;
    io::Printer::Print<>(local_78,text_01);
    pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent * 2;
    pDVar10 = *(Descriptor **)&pDVar9->field_count_;
    if (0 < pDVar10->field_count_) {
      pFVar1 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
               &pDVar9->containing_type_;
      lVar20 = 0;
      lVar21 = 0;
      do {
        bVar7 = IsRealOneof((FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar20));
        if (!bVar7) {
          pDVar9 = *(Descriptor **)&pDVar9->field_count_;
          lVar18 = (long)pDVar9->field_count_;
          if (lVar21 < lVar18) {
            pcVar14 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar21,lVar18,"index < field_count()");
          }
          if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_002aefc3;
          pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                    get(pFVar1,(FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar20));
          (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[0x10])(pIVar11,pPVar17);
          pDVar9 = local_80;
        }
        lVar21 = lVar21 + 1;
        pDVar10 = *(Descriptor **)&pDVar9->field_count_;
        lVar20 = lVar20 + 0x58;
      } while (lVar21 < pDVar10->field_count_);
    }
    io::Printer::Outdent(pPVar17);
    io::Printer::Outdent(pPVar17);
    text_02._M_str = "  }\n}\n";
    text_02._M_len = 6;
    io::Printer::Print<>(pPVar17,text_02);
  }
  text_03._M_str = "@java.lang.Override\npublic Builder clear() {\n  super.clear();\n";
  text_03._M_len = 0x3e;
  io::Printer::Print<>(pPVar17,text_03);
  pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent;
  iVar3 = (*(Descriptor **)&pDVar9->field_count_)->field_count_;
  if (0 < iVar3) {
    uVar8 = iVar3 + 0x1fU >> 5;
    uVar16 = 1;
    if (1 < uVar8) {
      uVar16 = uVar8;
    }
    uVar8 = 0;
    uVar15 = extraout_RDX;
    do {
      GetBitFieldName_abi_cxx11_((string *)local_a0,(java *)(ulong)uVar8,(int)uVar15);
      text_04._M_str = "$bit_field_name$ = 0;\n";
      text_04._M_len = 0x16;
      io::Printer::Print<char[15],std::__cxx11::string>
                (local_78,text_04,(char (*) [15])"bit_field_name",(string *)local_a0);
      uVar15 = extraout_RDX_00;
      if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
           *)local_a0._0_8_ !=
          (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
           *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1)
        ;
        uVar15 = extraout_RDX_01;
      }
      uVar8 = uVar8 + 1;
    } while (uVar16 != uVar8);
  }
  pPVar17 = local_78;
  pDVar10 = *(Descriptor **)&pDVar9->field_count_;
  if (0 < pDVar10->field_count_) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                            *)&pDVar9->containing_type_,
                           (FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar20));
      (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[0xb])(pIVar11,pPVar17);
      lVar21 = lVar21 + 1;
      pDVar10 = *(Descriptor **)&pDVar9->field_count_;
      lVar20 = lVar20 + 0x58;
    } while (lVar21 < pDVar10->field_count_);
  }
  this_00 = (btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
             *)&pDVar9->fields_;
  iVar22 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_a0._0_8_ = iVar22.node_;
  local_a0._8_4_ = iVar22.position_;
  local_70 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)this_00
  ;
  iVar22 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  bVar7 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                    *)local_a0,(const_iterator)iVar22);
  if (!bVar7) {
    do {
      ppVar12 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                             *)local_a0);
      pOVar13 = Context::GetOneofGeneratorInfo
                          ((Context *)(pDVar9->all_names_).payload_,ppVar12->second);
      text_05._M_str = "$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n";
      text_05._M_len = 0x2d;
      io::Printer::Print<char[11],std::__cxx11::string>
                (pPVar17,text_05,(char (*) [11])0x5c90c8,&pOVar13->name);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)local_a0);
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                     *)SUB128(iVar22._0_12_,0);
      other.position_ = SUB124(iVar22._0_12_,8);
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                        *)local_a0,other);
    } while (!bVar7);
  }
  io::Printer::Outdent(pPVar17);
  text_06._M_str = "  return this;\n}\n\n";
  text_06._M_len = 0x12;
  io::Printer::Print<>(pPVar17,text_06);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
             (*(Descriptor **)&pDVar9->field_count_)->file_,true);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_58,(java *)*(Descriptor **)&pDVar9->field_count_,descriptor);
  text_07._M_str =
       "@java.lang.Override\npublic com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
  ;
  text_07._M_len = 0x9d;
  io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
            (pPVar17,text_07,(char (*) [10])"fileclass",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             (char (*) [11])0x578ccb,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
             *(Descriptor **)&pDVar9->field_count_,true);
  text_08._M_str =
       "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
  ;
  text_08._M_len = 0x73;
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar17,text_08,(char (*) [10])0x5620ff,(string *)local_a0);
  if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
             *(Descriptor **)&pDVar9->field_count_,true);
  text_09._M_str =
       "@java.lang.Override\npublic $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
  ;
  text_09._M_len = 0xc5;
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar17,text_09,(char (*) [10])0x5620ff,(string *)local_a0);
  if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)local_a0._0_8_ !=
      (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
       *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
  }
  GenerateBuildPartial((MessageBuilderGenerator *)pDVar9,pPVar17);
  bVar7 = Context::HasGeneratedMethods
                    ((Context *)(pDVar9->all_names_).payload_,*(Descriptor **)&pDVar9->field_count_)
  ;
  if (bVar7) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
               *(Descriptor **)&pDVar9->field_count_,true);
    text_10._M_str =
         "@java.lang.Override\npublic Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
    ;
    text_10._M_len = 0xe1;
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar17,text_10,(char (*) [10])0x5620ff,(string *)local_a0);
    if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         *)local_a0._0_8_ !=
        (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_a0,(ClassNameResolver *)pDVar9->file_,
               *(Descriptor **)&pDVar9->field_count_,true);
    text_11._M_str =
         "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
    ;
    text_11._M_len = 0x6c;
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar17,text_11,(char (*) [10])0x5620ff,(string *)local_a0);
    if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         *)local_a0._0_8_ !=
        (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent;
    pDVar9 = *(Descriptor **)&pDVar9->field_count_;
    if (0 < pDVar9->field_count_) {
      pFVar1 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
               &local_80->containing_type_;
      lVar20 = 0;
      lVar21 = 0;
      do {
        bVar7 = IsRealOneof((FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar20));
        if (!bVar7) {
          pDVar9 = *(Descriptor **)&local_80->field_count_;
          lVar18 = (long)pDVar9->field_count_;
          if (lVar21 < lVar18) {
            pcVar14 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar21,lVar18,"index < field_count()");
          }
          if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_002aefd0;
          pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                    get(pFVar1,(FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + lVar20));
          (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar11,pPVar17);
        }
        lVar21 = lVar21 + 1;
        pDVar9 = *(Descriptor **)&local_80->field_count_;
        lVar20 = lVar20 + 0x58;
      } while (lVar21 < pDVar9->field_count_);
    }
    pFVar1 = local_70;
    iVar22 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)local_70);
    local_58._M_dataplus._M_p = (pointer)iVar22.node_;
    local_58._M_string_length._0_4_ = iVar22.position_;
    iVar22 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)pFVar1);
    local_60 = iVar22.node_;
    local_64 = iVar22.position_;
    bVar7 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                      *)&local_58,(const_iterator)iVar22);
    if (!bVar7) {
      local_70 = (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
                 &local_80->containing_type_;
      do {
        ppVar12 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)&local_58);
        oneof = ppVar12->second;
        pOVar13 = Context::GetOneofGeneratorInfo((Context *)(local_80->all_names_).payload_,oneof);
        text_12._M_str = "switch (other.get$oneof_capitalized_name$Case()) {\n";
        text_12._M_len = 0x33;
        io::Printer::Print<char[23],std::__cxx11::string>
                  (pPVar17,text_12,(char (*) [23])"oneof_capitalized_name",
                   &pOVar13->capitalized_name);
        pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent;
        if (0 < oneof->field_count_) {
          lVar21 = 0;
          lVar20 = 0;
          do {
            pFVar4 = oneof->fields_;
            puVar5 = *(ushort **)((long)&(pFVar4->all_names_).payload_ + lVar21);
            uVar2 = *puVar5;
            local_a0._0_8_ = local_a0 + 0x10;
            local_a0._8_8_ = (Descriptor *)0x0;
            local_90._M_local_buf[0] = '\0';
            std::__cxx11::string::resize((ulong)local_a0,(char)uVar2);
            absl::lts_20250127::ascii_internal::AsciiStrToUpper
                      ((Nonnull<char_*>)local_a0._0_8_,
                       (Nullable<const_char_*>)((long)puVar5 + ~(ulong)uVar2),(ulong)uVar2);
            pPVar17 = local_78;
            text_13._M_str = "case $field_name$: {\n";
            text_13._M_len = 0x15;
            io::Printer::Print<char[11],std::__cxx11::string>
                      (local_78,text_13,(char (*) [11])0x5e56e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
            if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)local_a0._0_8_ !=
                (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,
                              CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]
                                      ) + 1);
            }
            pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent;
            pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                      get(local_70,(FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar21));
            (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar11,pPVar17);
            text_14._M_str = "break;\n";
            text_14._M_len = 7;
            io::Printer::Print<>(pPVar17,text_14);
            io::Printer::Outdent(pPVar17);
            text_15._M_str = "}\n";
            text_15._M_len = 2;
            io::Printer::Print<>(pPVar17,text_15);
            lVar20 = lVar20 + 1;
            lVar21 = lVar21 + 0x58;
          } while (lVar20 < oneof->field_count_);
        }
        pOVar13 = Context::GetOneofGeneratorInfo((Context *)(local_80->all_names_).payload_,oneof);
        src = (pOVar13->name)._M_dataplus._M_p;
        n = (pOVar13->name)._M_string_length;
        local_a0._0_8_ = local_a0 + 0x10;
        local_a0._8_8_ = (Descriptor *)0x0;
        local_90._M_local_buf[0] = '\0';
        std::__cxx11::string::resize((ulong)local_a0,(char)n);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper((Nonnull<char_*>)local_a0._0_8_,src,n);
        text_16._M_str = "case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n";
        text_16._M_len = 0x2c;
        io::Printer::Print<char[15],std::__cxx11::string>
                  (pPVar17,text_16,(char (*) [15])"cap_oneof_name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        if ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
             *)local_a0._0_8_ !=
            (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
             *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,
                          CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) +
                          1);
        }
        io::Printer::Outdent(pPVar17);
        text_17._M_str = "}\n";
        text_17._M_len = 2;
        io::Printer::Print<>(pPVar17,text_17);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     *)&local_58);
        other_00.position_ = local_64;
        other_00.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
              *)local_60;
        other_00._12_4_ = 0;
        bVar7 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)&local_58,other_00);
      } while (!bVar7);
    }
    io::Printer::Outdent(pPVar17);
    if (0 < (*(Descriptor **)&local_80->field_count_)->extension_range_count_) {
      text_18._M_str = "  this.mergeExtensionFields(other);\n";
      text_18._M_len = 0x24;
      io::Printer::Print<>(pPVar17,text_18);
    }
    text_19._M_str = "  this.mergeUnknownFields(other.getUnknownFields());\n";
    text_19._M_len = 0x35;
    io::Printer::Print<>(pPVar17,text_19);
    text_20._M_str = "  onChanged();\n";
    text_20._M_len = 0xf;
    io::Printer::Print<>(pPVar17,text_20);
    text_21._M_str = "  return this;\n}\n\n";
    text_21._M_len = 0x12;
    io::Printer::Print<>(pPVar17,text_21);
  }
  return;
LAB_002aefc3:
  GenerateCommonBuilderMethods();
LAB_002aefd0:
  GenerateCommonBuilderMethods();
LAB_002aefdd:
  GenerateCommonBuilderMethods();
LAB_002aefea:
  protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb63);
}

Assistant:

void MessageBuilderGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  // Decide if we really need to have the "maybeForceBuilderInitialization()"
  // method.
  // TODO: Remove the need for this entirely
  bool need_maybe_force_builder_init = false;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->message_type() != nullptr &&
        !IsRealOneof(descriptor_->field(i)) &&
        HasHasbit(descriptor_->field(i))) {
      need_maybe_force_builder_init = true;
      break;
    }
  }

  const char* force_builder_init = need_maybe_force_builder_init
                                       ? "  maybeForceBuilderInitialization();"
                                       : "";

  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "$force_builder_init$\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "$force_builder_init$\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  if (need_maybe_force_builder_init) {
    printer->Print(
        "private void maybeForceBuilderInitialization() {\n"
        "  if (com.google.protobuf.GeneratedMessage\n"
        "          .alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateFieldBuilderInitializationCode(printer);
      }
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "}\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "public Builder clear() {\n"
      "  super.clear();\n");

  printer->Indent();
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  for (auto& kv : oneofs_) {
    printer->Print(
        "$oneof_name$Case_ = 0;\n"
        "$oneof_name$_ = null;\n",
        "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
  }

  printer->Outdent();

  printer->Print(
      "  return this;\n"
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return $classname$.getDefaultInstance();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ build() {\n"
      "  $classname$ result = buildPartial();\n"
      "  if (!result.isInitialized()) {\n"
      "    throw newUninitializedMessageException(result);\n"
      "  }\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateBuildPartial(printer);

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "@java.lang.Override\n"
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
        "public Builder mergeFrom($classname$ other) {\n"
        // Optimization:  If other is the default instance, we know none of its
        //   fields are set so we can skip the merge.
        "  if (other == $classname$.getDefaultInstance()) return this;\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print("switch (other.get$oneof_capitalized_name$Case()) {\n",
                     "oneof_capitalized_name",
                     context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
      printer->Indent();
      for (int j = 0; j < oneof->field_count(); j++) {
        const FieldDescriptor* field = oneof->field(j);
        printer->Print("case $field_name$: {\n", "field_name",
                       absl::AsciiStrToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print("break;\n");
        printer->Outdent();
        printer->Print("}\n");
      }
      printer->Print(
          "case $cap_oneof_name$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          "cap_oneof_name",
          absl::AsciiStrToUpper(context_->GetOneofGeneratorInfo(oneof)->name));
      printer->Outdent();
      printer->Print("}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("  this.mergeExtensionFields(other);\n");
    }

    printer->Print("  this.mergeUnknownFields(other.getUnknownFields());\n");

    printer->Print("  onChanged();\n");

    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }
}